

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O0

DWORD __thiscall
TRootHandler_TVFS::ParsePathFileTable
          (TRootHandler_TVFS *this,TCascStorage *hs,TVFS_DIRECTORY_HEADER *DirHeader,
          PATH_BUFFER *PathBuffer,LPBYTE pbPathTablePtr,LPBYTE pbPathTableEnd)

{
  DWORD DVar1;
  int iVar2;
  uint uVar3;
  LPBYTE pbDirectoryEnd;
  int nError;
  DWORD dwSpanSize;
  char *szSavePathPtr;
  ENCODED_KEY EKey;
  TVFS_PATH_TABLE_ENTRY PathEntry;
  TVFS_DIRECTORY_HEADER SubHeader;
  LPBYTE pbPathTableEnd_local;
  LPBYTE pbPathTablePtr_local;
  PATH_BUFFER *PathBuffer_local;
  TVFS_DIRECTORY_HEADER *DirHeader_local;
  TCascStorage *hs_local;
  TRootHandler_TVFS *this_local;
  
  _nError = PathBuffer->szPtr;
  pbDirectoryEnd._4_4_ = 0;
  memset(&szSavePathPtr,0,0x10);
  pbPathTableEnd_local = pbPathTablePtr;
  do {
    do {
      if (pbPathTableEnd <= pbPathTableEnd_local) {
        return 0;
      }
      pbPathTableEnd_local =
           CapturePathEntry(this,(TVFS_PATH_TABLE_ENTRY *)(EKey.Value + 8),pbPathTableEnd_local,
                            pbPathTableEnd);
      if (pbPathTableEnd_local == (LPBYTE)0x0) {
        return 1000;
      }
      PathBuffer_AppendNode(this,PathBuffer,(TVFS_PATH_TABLE_ENTRY *)(EKey.Value + 8));
    } while (((uint)PathEntry.pbNameEnd & 4) == 0);
    if ((PathEntry.pbNameEnd._4_4_ & 0x80000000) == 0) {
      pbDirectoryEnd._0_4_ =
           CaptureVfsSpanEntries
                     (this,DirHeader,(PENCODED_KEY)&szSavePathPtr,
                      (PDWORD)((long)&pbDirectoryEnd + 4),PathEntry.pbNameEnd._4_4_);
      if ((DWORD)pbDirectoryEnd != 0) {
        return (DWORD)pbDirectoryEnd;
      }
      iVar2 = IsVfsSubDirectory(this,hs,DirHeader,(TVFS_DIRECTORY_HEADER *)&PathEntry.NodeFlags,
                                (ENCODED_KEY *)&szSavePathPtr,pbDirectoryEnd._4_4_);
      if (iVar2 == 0) {
        PathBuffer_AddChar(this,PathBuffer,':');
        CASC_FILE_TREE::Insert
                  (&(this->super_TFileTreeRoot).FileTree,(PCONTENT_KEY)&szSavePathPtr,
                   PathBuffer->szBegin,0xffffffff,pbDirectoryEnd._4_4_,0xffffffff);
        ParseDirectoryData(this,hs,(TVFS_DIRECTORY_HEADER *)&PathEntry.NodeFlags,PathBuffer);
        free((void *)SubHeader._48_8_);
      }
      else {
        CASC_FILE_TREE::Insert
                  (&(this->super_TFileTreeRoot).FileTree,(PCONTENT_KEY)&szSavePathPtr,
                   PathBuffer->szBegin,0xffffffff,pbDirectoryEnd._4_4_,0xffffffff);
      }
    }
    else {
      uVar3 = PathEntry.pbNameEnd._4_4_ & 0x7fffffff;
      if ((PathEntry.pbNameEnd._4_4_ & 0x7fffffff) < 4) {
        __assert_fail("(PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_TVFS.cpp"
                      ,0x1c2,
                      "DWORD TRootHandler_TVFS::ParsePathFileTable(TCascStorage *, TVFS_DIRECTORY_HEADER &, PATH_BUFFER &, LPBYTE, LPBYTE)"
                     );
      }
      DVar1 = ParsePathFileTable(this,hs,DirHeader,PathBuffer,pbPathTableEnd_local,
                                 pbPathTableEnd_local + ((ulong)uVar3 - 4));
      if (DVar1 != 0) {
        return DVar1;
      }
      pbDirectoryEnd._0_4_ = 0;
      pbPathTableEnd_local = pbPathTableEnd_local + ((ulong)uVar3 - 4);
    }
    PathBuffer->szPtr = _nError;
    *PathBuffer->szPtr = '\0';
  } while( true );
}

Assistant:

DWORD ParsePathFileTable(TCascStorage * hs, TVFS_DIRECTORY_HEADER & DirHeader, PATH_BUFFER & PathBuffer, LPBYTE pbPathTablePtr, LPBYTE pbPathTableEnd)
    {
        TVFS_DIRECTORY_HEADER SubHeader;
        TVFS_PATH_TABLE_ENTRY PathEntry;
        ENCODED_KEY EKey;
        char * szSavePathPtr = PathBuffer.szPtr;
        DWORD dwSpanSize = 0;
        int nError;

        // Prepare the EKey structure to be filled with zeros
        memset(&EKey, 0, sizeof(ENCODED_KEY));

        // Parse the file table
        while(pbPathTablePtr < pbPathTableEnd)
        {
            // Capture the single path table entry
            pbPathTablePtr = CapturePathEntry(PathEntry, pbPathTablePtr, pbPathTableEnd);
            if(pbPathTablePtr == NULL)
                return ERROR_BAD_FORMAT;

            // Append the node name to the total path. Also add backslash, if it's a folder
            PathBuffer_AppendNode(PathBuffer, PathEntry);

            // Folder component
            if (PathEntry.NodeFlags & TVFS_PTE_NODE_VALUE)
            {
                // If the TVFS_FOLDER_NODE is set, then the path node is a directory,
                // with its data immediately following the path node. Lower 31 bits of NodeValue
                // contain the length of the directory (including the NodeValue!)
                if (PathEntry.NodeValue & TVFS_FOLDER_NODE)
                {
                    LPBYTE pbDirectoryEnd = pbPathTablePtr + (PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) - sizeof(DWORD);

                    // Check the available data
                    assert((PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD));

                    // Recursively call the folder parser on the same file
                    nError = ParsePathFileTable(hs, DirHeader, PathBuffer, pbPathTablePtr, pbDirectoryEnd);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // Skip the directory data
                    pbPathTablePtr = pbDirectoryEnd;
                }
                else
                {
                    // Capture the VFS and Container Table Entry in order to get the file EKey
                    nError = CaptureVfsSpanEntries(DirHeader, &EKey, &dwSpanSize, PathEntry.NodeValue);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // We need to check whether this is another TVFS directory file
                    if (IsVfsSubDirectory(hs, DirHeader, SubHeader, EKey, dwSpanSize) == ERROR_SUCCESS)
                    {
                        // Add colon (':')
                        PathBuffer_AddChar(PathBuffer, ':');

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);

                        ParseDirectoryData(hs, SubHeader, PathBuffer);
                        CASC_FREE(SubHeader.pbDirectoryData);
                    }
                    else
                    {
//                      if (fp != NULL)
//                      {
//                          fwrite(PathBuffer.szBegin, 1, (PathBuffer.szPtr - PathBuffer.szBegin), fp);
//                          fprintf(fp, "\n");
//                      }

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);
                    }
                }

                // Reset the position of the path buffer
                PathBuffer.szPtr = szSavePathPtr;
                PathBuffer.szPtr[0] = 0;
            }
        }

        // Return the total number of entries
        return ERROR_SUCCESS;
    }